

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  size_t max;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  CURLcode CVar10;
  byte *__s;
  char *pcVar11;
  char *pcVar12;
  byte *pbVar13;
  bool bVar14;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_0053ad96:
  pcVar12 = conn_to_host->data;
  if (*pcVar12 == ':') {
LAB_0053ae32:
    if (pcVar12[1] != ':') {
      pcVar11 = strchr(pcVar12 + 1,0x3a);
      if (pcVar11 != (char *)0x0) {
        local_38 = (char *)0x0;
        lVar8 = strtol(pcVar12 + 1,&local_38,10);
        if ((local_38 == pcVar11) && (lVar8 == conn->remote_port)) {
          pcVar12 = pcVar11 + 1;
          goto LAB_0053ae42;
        }
      }
LAB_0053afa0:
      uVar5 = 0xffffffff;
      pcVar12 = (char *)0x0;
      goto LAB_0053afa3;
    }
    pcVar12 = pcVar12 + 2;
LAB_0053ae42:
    if (*pcVar12 == '\0') goto LAB_0053afa0;
    pbVar6 = (byte *)(*Curl_cstrdup)(pcVar12);
    if (pbVar6 == (byte *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __s = pbVar6;
    pbVar13 = pbVar6;
    if (*pbVar6 == 0x5b) {
      pbVar13 = pbVar6 + 1;
      bVar3 = pbVar6[1];
      __s = pbVar13;
      while (bVar3 != 0) {
        if ((9 < (byte)(bVar3 - 0x30)) &&
           ((0x38 < bVar3 - 0x2e ||
            ((0x1f8000001f81001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) == 0)))) {
          if (bVar3 != 0x25) goto LAB_0053b0b6;
          uVar5 = (uint)__s[1];
          iVar4 = __s[1] - 0x32;
          if (iVar4 == 0) {
            iVar4 = 0x35 - (uint)__s[2];
          }
          else {
            iVar4 = -iVar4;
          }
          __s = __s + 1;
          if (iVar4 != 0) {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
            uVar5 = (uint)*__s;
          }
          goto LAB_0053b07c;
        }
        pbVar1 = __s + 1;
        __s = __s + 1;
        bVar3 = *pbVar1;
      }
      goto LAB_0053aeb9;
    }
    goto LAB_0053aecc;
  }
  bVar14 = (*(uint *)&(conn->bits).field_0x4 >> 0xb & 1) == 0;
  pcVar11 = "[";
  if (bVar14) {
    pcVar11 = "";
  }
  pcVar9 = "]";
  if (bVar14) {
    pcVar9 = "";
  }
  pcVar11 = curl_maprintf("%s%s%s",pcVar11,(conn->host).name,pcVar9);
  if (pcVar11 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar11);
  iVar4 = Curl_strncasecompare(pcVar12,pcVar11,max);
  (*Curl_cfree)(pcVar11);
  if ((iVar4 != 0) && (pcVar12[max] == ':')) {
    pcVar12 = pcVar12 + max;
    goto LAB_0053ae32;
  }
  pcVar12 = (char *)0x0;
  uVar5 = 0xffffffff;
  goto LAB_0053afa3;
LAB_0053b07c:
  bVar3 = (byte)uVar5;
  if (bVar3 == 0) goto LAB_0053aeb9;
  if ((((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) && (1 < uVar5 - 0x2d))
     && ((uVar5 != 0x7e && (uVar5 != 0x5f)))) goto LAB_0053b0b6;
  uVar5 = (uint)__s[1];
  __s = __s + 1;
  goto LAB_0053b07c;
LAB_0053b0b6:
  if (bVar3 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0053aeb9:
    Curl_infof(data,"Invalid IPv6 address format");
  }
LAB_0053aecc:
  pcVar12 = strchr((char *)__s,0x3a);
  if (pcVar12 == (char *)0x0) {
LAB_0053afdb:
    uVar7 = 0xffffffff;
  }
  else {
    local_38 = (char *)0x0;
    *pcVar12 = '\0';
    if (pcVar12[1] == '\0') goto LAB_0053afdb;
    uVar7 = strtol(pcVar12 + 1,&local_38,10);
    if (((local_38 != (char *)0x0) && (*local_38 != '\0')) || (0xffff < uVar7)) {
      Curl_failf(data,"No valid port number in connect to host string (%s)",pcVar12 + 1);
      CVar10 = CURLE_SETOPT_OPTION_SYNTAX;
      goto LAB_0053b11f;
    }
  }
  uVar5 = (uint)uVar7;
  pcVar12 = (*Curl_cstrdup)((char *)pbVar13);
  if (pcVar12 != (char *)0x0) {
    (*Curl_cfree)(pbVar6);
    if (*pcVar12 == '\0') {
LAB_0053afa3:
      puVar2 = &(conn->bits).field_0x5;
      *puVar2 = *puVar2 & 0xfd;
      (*Curl_cfree)(pcVar12);
      bVar3 = 1;
    }
    else {
      (conn->conn_to_host).rawalloc = pcVar12;
      (conn->conn_to_host).name = pcVar12;
      puVar2 = &(conn->bits).field_0x5;
      *puVar2 = *puVar2 | 2;
      bVar3 = 0;
      Curl_infof(data,"Connecting to hostname: %s",pcVar12);
    }
    if (-1 < (int)uVar5) {
      conn->conn_to_port = uVar5;
      puVar2 = &(conn->bits).field_0x5;
      *puVar2 = *puVar2 | 4;
      Curl_infof(data,"Connecting to port: %d",(ulong)uVar5);
      return CURLE_OK;
    }
    puVar2 = &(conn->bits).field_0x5;
    *puVar2 = *puVar2 & 0xfb;
    conn_to_host = conn_to_host->next;
    if (!(bool)(bVar3 & conn_to_host != (curl_slist *)0x0)) {
      return CURLE_OK;
    }
    goto LAB_0053ad96;
  }
  CVar10 = CURLE_OUT_OF_MEMORY;
LAB_0053b11f:
  (*Curl_cfree)(pbVar6);
  return CVar10;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef CURLDEBUG
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid;
    bool hit;
    struct altsvc *as;
    const int allowed_versions = ( ALPN_h1
#ifdef USE_HTTP2
                                   | ALPN_h2
#endif
#ifdef ENABLE_QUIC
                                   | ALPN_h3
#endif
      ) & data->asi->flags;

    host = conn->host.rawalloc;
#ifdef USE_HTTP2
    /* with h2 support, check that first */
    srcalpnid = ALPN_h2;
    hit = Curl_altsvc_lookup(data->asi,
                             srcalpnid, host, conn->remote_port, /* from */
                             &as /* to */,
                             allowed_versions);
    if(!hit)
#endif
    {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               srcalpnid, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_versions);
    }
    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          conn->httpversion = 11;
          break;
        case ALPN_h2:
          conn->httpversion = 20;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          conn->httpversion = 30;
          break;
        default: /* shouldn't be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}